

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoaderDriver.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  Map *pMVar2;
  AlternativeLoader *this;
  MapLoaderAdapter *this_00;
  undefined4 extraout_var;
  allocator<char> local_c9;
  MapLoader myLoader;
  string MAP3;
  string MAP2;
  string local_78;
  string local_58;
  string MAP1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MAP1,"debugValid.map",(allocator<char> *)&MAP2);
  std::__cxx11::string::string((string *)&local_58,(string *)&MAP1);
  MapLoader::MapLoader(&myLoader,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator<<((ostream *)&std::cout,"creating map 1 (valid)\n");
  pMVar2 = MapLoader::readMapFile(&myLoader);
  std::operator<<((ostream *)&std::cout,"\nmap 1 creation completed.\n");
  if (pMVar2 != (Map *)0x0) {
    Map::printMap(pMVar2);
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MAP2,"world2Invalid.map",(allocator<char> *)&MAP3);
  std::__cxx11::string::string((string *)&local_78,(string *)&MAP2);
  MapLoader::setMapFile(&myLoader,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator<<((ostream *)&std::cout,"\ncreating map 2 (invalid)\n");
  pMVar2 = MapLoader::readMapFile(&myLoader);
  std::operator<<((ostream *)&std::cout,"map 2 creation attempt completed.\n");
  if (pMVar2 != (Map *)0x0) {
    Map::printMap(pMVar2);
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&MAP3,"africa.map",&local_c9);
  this = (AlternativeLoader *)operator_new(8);
  AlternativeLoader::AlternativeLoader(this,&MAP3);
  std::operator<<((ostream *)&std::cout,"creating map 3 using alternative loader directly (valid)\n"
                 );
  pMVar2 = AlternativeLoader::altReadMapFile(this);
  std::operator<<((ostream *)&std::cout,"\nmap 3 creation completed.\n");
  if (pMVar2 != (Map *)0x0) {
    Map::printMap(pMVar2);
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::operator<<((ostream *)&std::cout,"creating map 4 using adapter (valid)\n");
  this_00 = (MapLoaderAdapter *)operator_new(0x18);
  MapLoaderAdapter::MapLoaderAdapter(this_00,this);
  iVar1 = (*(this_00->super_MapLoader)._vptr_MapLoader[2])(this_00);
  if ((Map *)CONCAT44(extraout_var,iVar1) != (Map *)0x0) {
    Map::printMap((Map *)CONCAT44(extraout_var,iVar1));
  }
  (*(this_00->super_MapLoader)._vptr_MapLoader[1])(this_00);
  std::__cxx11::string::~string((string *)&MAP3);
  std::__cxx11::string::~string((string *)&MAP2);
  MapLoader::~MapLoader(&myLoader);
  std::__cxx11::string::~string((string *)&MAP1);
  return 0;
}

Assistant:

int main() {
    //init loader
    const std::string MAP1 = "debugValid.map";
    MapLoader myLoader = MapLoader(MAP1);

    //create first (valid) map
    std::cout << "creating map 1 (valid)\n";
    Map* firstMap = myLoader.readMapFile();
    std::cout << "\nmap 1 creation completed.\n";
    if (firstMap) {
        firstMap->printMap();
    }
    
    //create second (invalid) map
    /*
     * this map is invalid in many ways. Alaska is assigned to a continent
     * that doesnt exist, alberta has a wrong country ID and it is not a
     * connected graph (that can be tested for in Map.cpp).
     */
    std::cout << "\n\n";
    const std::string MAP2 = "world2Invalid.map";
    myLoader.setMapFile(MAP2);
    std::cout << "\ncreating map 2 (invalid)\n";
    Map* secondMap = myLoader.readMapFile();
    std::cout << "map 2 creation attempt completed.\n";
    if (secondMap) {
        secondMap->printMap();
    }

    //init alternative loader
    std::cout << "\n\n";
    const std::string MAP3 = "africa.map";
    auto* altLoader = new AlternativeLoader(MAP3);

    std::cout << "creating map 3 using alternative loader directly (valid)\n";
    Map* thirdMap = altLoader->altReadMapFile();
    std::cout << "\nmap 3 creation completed.\n";
    if (thirdMap) {
        thirdMap->printMap();
    }

    //init adapter
    std::cout << "\n\n";
    std::cout << "creating map 4 using adapter (valid)\n";
    auto* adapter = new MapLoaderAdapter(altLoader);
    Map* fourthMap = adapter->readMapFile();
    if (fourthMap) {
        fourthMap->printMap();
    }

    delete(adapter);

    return 0;
}